

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Status __thiscall
leveldb::Version::Get(Version *this,ReadOptions *options,LookupKey *k,string *value,GetStats *stats)

{
  long *plVar1;
  long lVar2;
  char *pcVar3;
  Status SVar4;
  uint uVar5;
  int iVar6;
  size_type sVar7;
  ulong uVar8;
  long lVar9;
  Status *this_00;
  long *in_R9;
  FileMetaData **ppFVar10;
  long lVar11;
  ulong __n;
  FileMetaData *pFVar12;
  Status s;
  undefined4 local_f4;
  undefined1 local_f0 [24];
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> tmp;
  FileMetaData *f;
  size_t local_a0;
  Slice local_98;
  char *local_88;
  size_t sStack_80;
  GetStats *local_78;
  Slice user_key;
  Status local_50;
  FileMetaData *tmp2;
  Slice ikey;
  
  user_key.data_ = (char *)value->_M_string_length;
  ikey.size_ = (value->field_2)._M_allocated_capacity - (long)user_key.data_;
  user_key.size_ = ikey.size_ - 8;
  plVar1 = *(long **)(*(long *)options + 0x40);
  s.state_ = (char *)0x0;
  *in_R9 = 0;
  *(undefined4 *)(in_R9 + 1) = 0xffffffff;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f4 = 0xffffffff;
  sVar7 = 0;
  pFVar12 = (FileMetaData *)0x0;
  ikey.data_ = user_key.data_;
  do {
    if (sVar7 == 7) {
      local_98 = (Slice)ZEXT816(0x1247c3);
      local_f0._0_16_ = ZEXT816(0x1247c3);
      Status::NotFound((Status *)this,&local_98,(Slice *)local_f0);
LAB_00116936:
      std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
      ~_Vector_base(&tmp.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   );
      Status::~Status(&s);
      return (Status)(char *)this;
    }
    lVar9 = sVar7 * 0x18;
    lVar2 = *(long *)((long)options + lVar9 + 0x20);
    lVar11 = *(long *)((long)options + lVar9 + 0x28) - lVar2;
    if (lVar11 != 0) {
      __n = lVar11 >> 3;
      local_f0._16_8_ = sVar7;
      if (sVar7 == 0) {
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
                  (&tmp,__n);
        for (uVar5 = 0; uVar5 < __n; uVar5 = uVar5 + 1) {
          f = *(FileMetaData **)(lVar2 + (ulong)uVar5 * 8);
          local_98 = InternalKey::user_key(&f->smallest);
          iVar6 = (**(code **)(*plVar1 + 0x10))(plVar1,&user_key,&local_98);
          if (-1 < iVar6) {
            local_f0._0_16_ = (undefined1  [16])InternalKey::user_key(&f->largest);
            iVar6 = (**(code **)(*plVar1 + 0x10))(plVar1,&user_key,local_f0);
            if (iVar6 < 1) {
              std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              push_back(&tmp,&f);
            }
          }
        }
        sVar7 = local_f0._16_8_;
        if (tmp.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            tmp.
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00116895;
        std::
        __sort<__gnu_cxx::__normal_iterator<leveldb::FileMetaData**,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(leveldb::FileMetaData*,leveldb::FileMetaData*)>>
                  ((__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                    )tmp.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<leveldb::FileMetaData_**,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
                    )tmp.
                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<bool_(*)(leveldb::FileMetaData_*,_leveldb::FileMetaData_*)>)
                   0x116581);
        uVar8 = (long)tmp.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)tmp.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3;
        ppFVar10 = tmp.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        uVar5 = FindFile((InternalKeyComparator *)(*(long *)options + 0x38),
                         (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)((long)options + lVar9 + 0x20),&ikey);
        uVar8 = 0;
        ppFVar10 = (FileMetaData **)0x0;
        if (uVar5 < __n) {
          tmp2 = *(FileMetaData **)(lVar2 + (ulong)uVar5 * 8);
          local_98 = InternalKey::user_key(&tmp2->smallest);
          iVar6 = (**(code **)(*plVar1 + 0x10))(plVar1,&user_key,&local_98);
          uVar8 = (ulong)(-1 < iVar6);
          ppFVar10 = (FileMetaData **)0x0;
          if (-1 < iVar6) {
            ppFVar10 = &tmp2;
          }
        }
      }
      for (uVar5 = 0; sVar7 = local_f0._16_8_, uVar5 < uVar8; uVar5 = uVar5 + 1) {
        if ((pFVar12 != (FileMetaData *)0x0) && (*in_R9 == 0)) {
          *in_R9 = (long)pFVar12;
          *(undefined4 *)(in_R9 + 1) = local_f4;
        }
        pFVar12 = ppFVar10[uVar5];
        local_98.data_ = (char *)(local_98._4_8_ << 0x20);
        local_98.size_ = (size_t)plVar1;
        local_88 = user_key.data_;
        sStack_80 = user_key.size_;
        local_78 = stats;
        TableCache::Get((TableCache *)local_f0,*(ReadOptions **)(*(long *)options + 0x30),
                        (uint64_t)k,pFVar12->number,(Slice *)pFVar12->file_size,&ikey,
                        (_func_void_void_ptr_Slice_ptr_Slice_ptr *)&local_98);
        SVar4 = s;
        s.state_ = (char *)local_f0._0_8_;
        local_f0._0_8_ = SVar4.state_;
        Status::~Status((Status *)local_f0);
        if (s.state_ != (char *)0x0) {
LAB_00116929:
          this->vset_ = (VersionSet *)s.state_;
LAB_00116931:
          s.state_ = (char *)0x0;
          goto LAB_00116936;
        }
        if ((int)local_98.data_ == 3) {
          local_f0._8_8_ = 0x12;
          local_f0._0_8_ = "corrupted key for ";
          Status::Corruption((Status *)&f,(Slice *)local_f0,&user_key);
          this_00 = (Status *)&f;
LAB_00116916:
          pcVar3 = this_00->state_;
          this_00->state_ = s.state_;
          s.state_ = pcVar3;
          Status::~Status(this_00);
          goto LAB_00116929;
        }
        if ((int)local_98.data_ == 2) {
          local_f0._0_16_ = ZEXT816(0x1247c3);
          f = (FileMetaData *)0x1247c3;
          local_a0 = 0;
          Status::NotFound(&local_50,(Slice *)local_f0,(Slice *)&f);
          this_00 = &local_50;
          goto LAB_00116916;
        }
        if ((int)local_98.data_ == 1) {
          this->vset_ = (VersionSet *)0x0;
          goto LAB_00116931;
        }
        local_f4 = (undefined4)local_f0._16_8_;
      }
    }
LAB_00116895:
    sVar7 = sVar7 + 1;
  } while( true );
}

Assistant:

Status Version::Get(const ReadOptions& options, const LookupKey& k,
                    std::string* value, GetStats* stats) {
  Slice ikey = k.internal_key();
  Slice user_key = k.user_key();
  const Comparator* ucmp = vset_->icmp_.user_comparator();
  Status s;

  stats->seek_file = nullptr;
  stats->seek_file_level = -1;
  FileMetaData* last_file_read = nullptr;
  int last_file_read_level = -1;

  // We can search level-by-level since entries never hop across
  // levels.  Therefore we are guaranteed that if we find data
  // in a smaller level, later levels are irrelevant.
  std::vector<FileMetaData*> tmp;
  FileMetaData* tmp2;
  for (int level = 0; level < config::kNumLevels; level++) {
    size_t num_files = files_[level].size();
    if (num_files == 0) continue;

    // Get the list of files to search in this level
    FileMetaData* const* files = &files_[level][0];
    if (level == 0) {
      // Level-0 files may overlap each other.  Find all files that
      // overlap user_key and process them in order from newest to oldest.
      tmp.reserve(num_files);
      for (uint32_t i = 0; i < num_files; i++) {
        FileMetaData* f = files[i];
        if (ucmp->Compare(user_key, f->smallest.user_key()) >= 0 &&
            ucmp->Compare(user_key, f->largest.user_key()) <= 0) {
          tmp.push_back(f);
        }
      }
      if (tmp.empty()) continue;

      std::sort(tmp.begin(), tmp.end(), NewestFirst);
      files = &tmp[0];
      num_files = tmp.size();
    } else {
      // Binary search to find earliest index whose largest key >= ikey.
      uint32_t index = FindFile(vset_->icmp_, files_[level], ikey);
      if (index >= num_files) {
        files = nullptr;
        num_files = 0;
      } else {
        tmp2 = files[index];
        if (ucmp->Compare(user_key, tmp2->smallest.user_key()) < 0) {
          // All of "tmp2" is past any data for user_key
          files = nullptr;
          num_files = 0;
        } else {
          files = &tmp2;
          num_files = 1;
        }
      }
    }

    for (uint32_t i = 0; i < num_files; ++i) {
      if (last_file_read != nullptr && stats->seek_file == nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        stats->seek_file = last_file_read;
        stats->seek_file_level = last_file_read_level;
      }

      FileMetaData* f = files[i];
      last_file_read = f;
      last_file_read_level = level;

      Saver saver;
      saver.state = kNotFound;
      saver.ucmp = ucmp;
      saver.user_key = user_key;
      saver.value = value;
      s = vset_->table_cache_->Get(options, f->number, f->file_size, ikey,
                                   &saver, SaveValue);
      if (!s.ok()) {
        return s;
      }
      switch (saver.state) {
        case kNotFound:
          break;  // Keep searching in other files
        case kFound:
          return s;
        case kDeleted:
          s = Status::NotFound(Slice());  // Use empty error message for speed
          return s;
        case kCorrupt:
          s = Status::Corruption("corrupted key for ", user_key);
          return s;
      }
    }
  }

  return Status::NotFound(Slice());  // Use an empty error message for speed
}